

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O1

Var Js::AtomicsObject::EntryNotify(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  int32 iVar6;
  uint uVar7;
  int iVar8;
  undefined4 *puVar9;
  Var pvVar10;
  Var requestIndex;
  TypedArrayBase *pTVar11;
  undefined4 extraout_var;
  WaiterList *this;
  uint64 uVar12;
  uint64 uVar13;
  uint index;
  int32 count;
  double dVar14;
  int in_stack_00000010;
  undefined1 local_50 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xed,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b34803;
    *puVar9 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_50 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_50,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xed,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b34803;
    *puVar9 = 0;
  }
  if ((local_50._0_4_ & 0xffffff) < 3) {
    JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec12,L"Atomics.notify");
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_50,1);
  requestIndex = Arguments::operator[]((Arguments *)local_50,2);
  ValidateSharedIntegerTypedArray(pvVar10,pSVar1,true);
  uVar4 = ValidateAtomicAccess(pvVar10,requestIndex,pSVar1);
  pTVar11 = VarTo<Js::TypedArrayBase>(pvVar10);
  count = 0x7fffffff;
  if (((ulong)local_50 & 0xfffffc) != 0) {
    pvVar10 = Arguments::operator[]((Arguments *)local_50,3);
    BVar5 = JavascriptOperators::IsUndefinedObject(pvVar10);
    if (BVar5 == 0) {
      pvVar10 = Arguments::operator[]((Arguments *)local_50,3);
      if (((ulong)pvVar10 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00b34803;
        *puVar9 = 0;
      }
      if (((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
        dVar14 = (double)(int)pvVar10;
      }
      else {
        dVar14 = JavascriptConversion::ToInteger_Full(pvVar10,pSVar1);
      }
      bVar3 = NumberUtilities::IsNan(dVar14);
      count = 0x7fffffff;
      if (!bVar3) {
        bVar3 = NumberUtilities::IsSpecial(dVar14,0x7ff0000000000000);
        if (!bVar3) {
          iVar6 = JavascriptConversion::ToInt32(dVar14);
          count = 0;
          if (0 < iVar6) {
            count = iVar6;
          }
        }
      }
    }
  }
  if (pTVar11->BYTES_PER_ELEMENT != 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xfc,"(typedArrayBase->GetBytesPerElement() == 4)",
                                "typedArrayBase->GetBytesPerElement() == 4");
    if (!bVar3) goto LAB_00b34803;
    *puVar9 = 0;
  }
  index = uVar4 * 4 + pTVar11->byteOffset;
  uVar7 = (*(((pTVar11->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if (uVar7 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xfe,
                                "(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength())",
                                "bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength()");
    if (!bVar3) goto LAB_00b34803;
    *puVar9 = 0;
  }
  iVar8 = (*(((pTVar11->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x6f])();
  this = SharedArrayBuffer::GetWaiterList((SharedArrayBuffer *)CONCAT44(extraout_var,iVar8),index);
  CCLock::Enter(&(this->csForAccess).super_CCLock);
  uVar4 = WaiterList::RemoveAndWakeWaiters(this,count);
  CCLock::Leave(&(this->csForAccess).super_CCLock);
  if ((int)uVar4 < 0) {
    dVar14 = (double)uVar4;
    uVar12 = NumberUtilities::ToSpecial(dVar14);
    bVar3 = NumberUtilities::IsNan(dVar14);
    if (bVar3) {
      uVar13 = NumberUtilities::ToSpecial(dVar14);
      if (uVar13 != 0xfff8000000000000) {
        uVar13 = NumberUtilities::ToSpecial(dVar14);
        if (uVar13 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar3) {
LAB_00b34803:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar9 = 0;
        }
      }
    }
    pvVar10 = (Var)(uVar12 ^ 0xfffc000000000000);
  }
  else {
    pvVar10 = (Var)((ulong)uVar4 | 0x1000000000000);
  }
  return pvVar10;
}

Assistant:

Var AtomicsObject::EntryNotify(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ATOMICS_FUNCTION_ENTRY_CHECKS(2, "Atomics.notify");

        uint32 accessIndex = 0;
        TypedArrayBase *typedArrayBase = ValidateAndGetTypedArray(args[1], args[2], &accessIndex, scriptContext, true /*onlyInt32*/);
        int32 count = INT_MAX;
        if (args.Info.Count > 3 && !JavascriptOperators::IsUndefinedObject(args[3]))
        {
            double d = JavascriptConversion::ToInteger(args[3], scriptContext);
            if (!(NumberUtilities::IsNan(d) || JavascriptNumber::IsPosInf(d)))
            {
                int32 c = JavascriptConversion::ToInt32(d);
                count = max(0, c);
            }
        }

        Assert(typedArrayBase->GetBytesPerElement() == 4);
        uint32 bufferIndex = (accessIndex * 4) + typedArrayBase->GetByteOffset();
        Assert(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength());
        SharedArrayBuffer *sharedArrayBuffer = typedArrayBase->GetArrayBuffer()->GetAsSharedArrayBuffer();
        WaiterList *waiterList = sharedArrayBuffer->GetWaiterList(bufferIndex);

        uint32 removed = 0;
        {
            AutoCriticalSection autoCS(waiterList->GetCriticalSectionForAccess());
            removed = waiterList->RemoveAndWakeWaiters(count);
        }

        return JavascriptNumber::ToVar(removed, scriptContext);
    }